

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_creature_abstract::state_read
          (cse_alife_creature_abstract *this,xr_packet *packet,uint16_t size)

{
  float *dest;
  undefined8 uVar1;
  size_t sVar2;
  ushort uVar3;
  ulong in_RAX;
  ulong uVar4;
  uint value;
  uint value_1;
  undefined8 local_38;
  
  local_38 = in_RAX;
  cse_alife_dynamic_object_visual::state_read((cse_alife_dynamic_object_visual *)this,packet,0);
  xr_packet::r_raw(packet,&this->m_s_team,1);
  xr_packet::r_raw(packet,&this->m_s_squad,1);
  xr_packet::r_raw(packet,&this->m_s_group,1);
  uVar3 = *(ushort *)&this->field_0x28;
  dest = &this->m_health;
  if (uVar3 < 0x13) {
    *dest = *dest * 0.01;
LAB_001522f5:
    cse_visual::visual_read((cse_visual *)&this->field_0x118,packet,uVar3);
    uVar3 = *(ushort *)&this->field_0x28;
LAB_0015230b:
    if (uVar3 < 0x58) goto LAB_00152401;
  }
  else {
    xr_packet::r_raw(packet,dest,4);
    uVar3 = *(ushort *)&this->field_0x28;
    if (uVar3 < 0x73) {
      *dest = *dest * 0.01;
      if (uVar3 < 0x20) goto LAB_001522f5;
      goto LAB_0015230b;
    }
  }
  xr_packet::r_raw(packet,&local_38,4);
  uVar4 = local_38 & 0xffffffff;
  sVar2 = packet->m_r_pos;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (&this->m_dynamic_out_restrictions,uVar4);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)
             &this->m_dynamic_out_restrictions,packet->m_buf + sVar2,
             packet->m_buf + sVar2 + uVar4 * 2);
  packet->m_r_pos = packet->m_r_pos + uVar4 * 2;
  xr_packet::r_raw(packet,(void *)((long)&local_38 + 4),4);
  uVar4 = (ulong)local_38._4_4_;
  sVar2 = packet->m_r_pos;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (&this->m_dynamic_in_restrictions,uVar4);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)
             &this->m_dynamic_in_restrictions,packet->m_buf + sVar2,
             packet->m_buf + sVar2 + uVar4 * 2);
  packet->m_r_pos = packet->m_r_pos + uVar4 * 2;
  if (0x5e < *(ushort *)&this->field_0x28) {
    xr_packet::r_raw(packet,&this->m_killer_id,2);
    uVar3 = *(ushort *)&this->field_0x28;
    uVar1 = *(undefined8 *)&this->field_0x6c;
    (this->m_o_torso).yaw = (float)(int)((ulong)uVar1 >> 0x20);
    (this->m_o_torso).pitch = (float)(int)uVar1;
    if (uVar3 < 0x74) {
      return;
    }
    xr_packet::r_raw(packet,&this->m_game_death_time,8);
    return;
  }
LAB_00152401:
  uVar1 = *(undefined8 *)&this->field_0x6c;
  (this->m_o_torso).yaw = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_o_torso).pitch = (float)(int)uVar1;
  return;
}

Assistant:

void cse_alife_creature_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	packet.r_u8(m_s_team);
	packet.r_u8(m_s_squad);
	packet.r_u8(m_s_group);
	if (m_version > CSE_VERSION_0x12)
		packet.r_float(m_health);
	if (m_version < CSE_VERSION_0x73)
		m_health *= 0.01f;
	if (m_version < CSE_VERSION_0x20)
		cse_visual::visual_read(packet, m_version);
	if (m_version > CSE_VERSION_0x57) {
		packet.r_seq(packet.r_u32(), m_dynamic_out_restrictions);
		packet.r_seq(packet.r_u32(), m_dynamic_in_restrictions);
	}
	if (m_version > CSE_VERSION_0x5e)
		packet.r_u16(m_killer_id);
	m_o_torso.yaw = m_o_angle.y;
	m_o_torso.pitch = m_o_angle.x;
	if (m_version > CSE_VERSION_0x73)
		packet.r_u64(m_game_death_time);
}